

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_CwdRelativeInputs_Test::
TestBody(CommandLineInterfaceTest_CwdRelativeInputs_Test *this)

{
  string_view name;
  string_view contents;
  string *local_c8 [2];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str = "syntax = \"proto2\";\nmessage Foo {}\n";
  contents._M_len = 0x22;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir $tmpdir/foo.proto","");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  local_a8._M_allocated_capacity = (size_type)(string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b8 + 0x10),"test_generator","");
  local_c8[0] = (string *)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,anon_var_dwarf_a22956 + 5);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"foo.proto","");
  local_88._M_allocated_capacity = (size_type)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_98 + 0x10),"Foo","");
  CommandLineInterfaceTest::ExpectGenerated
            ((CommandLineInterfaceTest *)
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_dataplus._M_p,
             (string *)
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_string_length,(string *)local_a8._M_allocated_capacity,(string *)local_a8._8_8_,
             local_c8[0]);
  if ((long *)local_88._M_allocated_capacity != local_78) {
    operator_delete((void *)local_88._M_allocated_capacity,local_78[0] + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_c8[0] != (string *)local_b8) {
    operator_delete(local_c8[0],(ulong)(local_b8._0_8_ + 1));
  }
  if ((string *)local_a8._M_allocated_capacity != (string *)local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity,(ulong)(local_98._0_8_ + 1));
  }
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, CwdRelativeInputs) {
  // Test that we can accept working-directory-relative input files.

  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir $tmpdir/foo.proto");

  ExpectNoErrors();
  ExpectGenerated("test_generator", "", "foo.proto", "Foo");
}